

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialManager.cpp
# Opt level: O0

void __thiscall MT32Emu::PartialManager::~PartialManager(PartialManager *this)

{
  Partial *this_00;
  Bit32u BVar1;
  uint local_14;
  uint i;
  PartialManager *this_local;
  
  for (local_14 = 0; BVar1 = Synth::getPartialCount(this->synth), local_14 < BVar1;
      local_14 = local_14 + 1) {
    this_00 = this->partialTable[local_14];
    if (this_00 != (Partial *)0x0) {
      Partial::~Partial(this_00);
      operator_delete(this_00);
    }
    if ((this->freePolys[local_14] != (Poly *)0x0) && (this->freePolys[local_14] != (Poly *)0x0)) {
      operator_delete(this->freePolys[local_14]);
    }
  }
  if (this->partialTable != (Partial **)0x0) {
    operator_delete__(this->partialTable);
  }
  if (this->inactivePartials != (int *)0x0) {
    operator_delete__(this->inactivePartials);
  }
  if (this->freePolys != (Poly **)0x0) {
    operator_delete__(this->freePolys);
  }
  return;
}

Assistant:

PartialManager::~PartialManager(void) {
	for (unsigned int i = 0; i < synth->getPartialCount(); i++) {
		delete partialTable[i];
		if (freePolys[i] != NULL) delete freePolys[i];
	}
	delete[] partialTable;
	delete[] inactivePartials;
	delete[] freePolys;
}